

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

size_t ascii2dw(uint8_t *string)

{
  size_t sVar1;
  int alphalen;
  int len;
  uint8_t j;
  uint8_t i;
  uint8_t *string_local;
  
  sVar1 = strlen((char *)string);
  alphalen._3_1_ = 0;
  do {
    if ((int)sVar1 <= (int)(uint)alphalen._3_1_) {
      return (ulong)alphalen._3_1_;
    }
    for (alphalen._2_1_ = 0; alphalen._2_1_ < 0x61; alphalen._2_1_ = alphalen._2_1_ + 1) {
      if ((uint)string[alphalen._3_1_] ==
          (int)"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ[]\'*>_:=_.,-_?!;)(``/\'___________ \n"
               [alphalen._2_1_]) {
        string[alphalen._3_1_] = alphalen._2_1_;
        break;
      }
    }
    alphalen._3_1_ = alphalen._3_1_ + 1;
  } while( true );
}

Assistant:

size_t ascii2dw(uint8_t *string)
{
    uint8_t i, j;
    int len, alphalen;

    len = strlen((char*)string);
    alphalen = strlen(alphabet);
    for (i=0; i < len; i++) {
        for (j=0; j < alphalen; j++) {
            if (string[i] == alphabet[j]) {
                string[i] = j;
                break;
            }
        }
    }
    return i;
}